

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

ChStrainTensor<double> * __thiscall
chrono::fea::ChElementTetraCorot_10::GetStrain
          (ChStrainTensor<double> *__return_storage_ptr__,ChElementTetraCorot_10 *this,double z1,
          double z2,double z3,double z4)

{
  int iVar1;
  uint uVar2;
  ChMatrixDynamic<> amatrB;
  ChVectorDynamic<> displ;
  double JacobianDet;
  assign_op<double,_double> local_99;
  DenseStorage<double,__1,__1,__1,_1> local_98;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_40;
  undefined1 local_28 [8];
  
  local_60 = z1;
  local_58 = z2;
  local_50 = z3;
  local_48 = z4;
  iVar1 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_78,(long)iVar1);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[9])(this,&local_78);
  uVar2 = (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[4])(this);
  local_98.m_cols = 0;
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  if ((int)uVar2 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_98,(ulong)uVar2 * 6,6,(ulong)uVar2);
  local_40.m_rows.m_value = local_98.m_rows;
  local_40.m_cols.m_value = local_98.m_cols;
  local_40.m_functor.m_other = 0.0;
  if (-1 < (local_98.m_cols | local_98.m_rows)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              ((Matrix<double,__1,__1,_1,__1,__1> *)&local_98,&local_40,&local_99);
    (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[0xb])
              (local_60,local_58,local_50,local_48,this,&local_98,local_28);
    if (local_98.m_cols == local_78.m_storage.m_rows) {
      local_40.m_rows.m_value = (long)&local_98;
      local_40.m_cols.m_value = (long)&local_78;
      ChVoightTensor<double>::
      ChVoightTensor<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                (&__return_storage_ptr__->super_ChVoightTensor<double>,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                  *)&local_40);
      if (local_98.m_data != (double *)0x0) {
        free((void *)local_98.m_data[-1]);
      }
      if (local_78.m_storage.m_data != (double *)0x0) {
        free((void *)local_78.m_storage.m_data[-1]);
      }
      return __return_storage_ptr__;
    }
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                 );
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChStrainTensor<> ChElementTetraCorot_10::GetStrain(double z1, double z2, double z3, double z4) {
    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    double JacobianDet;
    ChMatrixDynamic<> amatrB(6, GetNdofs());
    amatrB.setZero();
    ComputeMatrB(amatrB, z1, z2, z3, z4, JacobianDet);

    ChStrainTensor<> mstrain = amatrB * displ;
    return mstrain;
}